

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_utils.cpp
# Opt level: O1

void HydroUtils::ComputeDivergence
               (Box *bx,Array4<double> *div,Array4<const_double> *fx,Array4<const_double> *fy,
               Array4<const_double> *fz,int ncomp,Geometry *geom,Real mult,
               bool fluxes_are_area_weighted)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  double *pdVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  double *pdVar25;
  int iVar26;
  long lVar27;
  double *pdVar28;
  long lVar29;
  double *pdVar30;
  long lVar31;
  double *pdVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  double *pdVar36;
  long lVar37;
  bool bVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  int local_154;
  ulong local_150;
  double *local_100;
  double *local_f8;
  double *local_f0;
  double *local_e8;
  double *local_e0;
  
  dVar41 = (geom->super_CoordSys).inv_dx[0];
  dVar39 = (geom->super_CoordSys).inv_dx[1];
  dVar40 = (geom->super_CoordSys).inv_dx[2];
  if (fluxes_are_area_weighted) {
    dVar39 = dVar41 * dVar39 * dVar40 * mult;
    dVar40 = dVar39;
    dVar41 = dVar39;
  }
  else {
    dVar41 = dVar41 * mult;
    dVar39 = dVar39 * mult;
    dVar40 = dVar40 * mult;
  }
  if (0 < ncomp) {
    lVar13 = div->jstride;
    lVar14 = fz->jstride;
    iVar1 = (bx->smallend).vect[1];
    lVar31 = (long)iVar1;
    iVar2 = (bx->smallend).vect[0];
    lVar33 = (long)iVar2;
    iVar3 = (fy->begin).y;
    lVar15 = fy->jstride;
    lVar29 = (long)(fy->begin).x;
    lVar34 = (long)(fx->begin).y;
    lVar16 = fx->jstride;
    local_f0 = fy->p + (((lVar31 - iVar3) * lVar15 + lVar33) - lVar29);
    local_100 = fy->p + (lVar33 - lVar29);
    iVar4 = (fx->begin).x;
    local_e0 = div->p + (((lVar31 - (div->begin).y) * lVar13 + lVar33) - (long)(div->begin).x);
    lVar29 = div->kstride;
    lVar17 = div->nstride;
    iVar5 = (div->begin).z;
    pdVar18 = fx->p;
    lVar19 = fx->kstride;
    lVar20 = fx->nstride;
    iVar6 = (fx->begin).z;
    lVar21 = fy->kstride;
    lVar22 = fy->nstride;
    iVar7 = (fy->begin).z;
    local_e8 = fz->p + (((lVar31 - (fz->begin).y) * lVar14 + lVar33) - (long)(fz->begin).x);
    lVar23 = fz->nstride;
    iVar8 = (fz->begin).z;
    iVar9 = (bx->smallend).vect[2];
    iVar10 = (bx->bigend).vect[2];
    iVar11 = (bx->bigend).vect[0];
    iVar12 = (bx->bigend).vect[1];
    lVar27 = fz->kstride * 8;
    local_f8 = pdVar18 + (((lVar31 - lVar34) * lVar16 + lVar33) - (long)iVar4);
    local_150 = 0;
    do {
      if (iVar9 <= iVar10) {
        iVar24 = iVar9;
        local_154 = iVar9 - iVar8;
        do {
          local_154 = local_154 + 1;
          if (iVar1 <= iVar12) {
            lVar33 = (long)iVar24;
            pdVar36 = (double *)((lVar33 - iVar5) * lVar29 * 8 + (long)local_e0);
            pdVar28 = (double *)((lVar33 - iVar8) * lVar27 + (long)local_e8);
            pdVar30 = (double *)(local_154 * lVar27 + (long)local_e8);
            lVar37 = (lVar33 - iVar7) * lVar21 * 8;
            pdVar32 = (double *)((long)local_f0 + lVar37);
            pdVar25 = (double *)((lVar33 - iVar6) * lVar19 * 8 + (long)local_f8);
            lVar33 = lVar31;
            iVar26 = iVar1 - iVar3;
            do {
              iVar26 = iVar26 + 1;
              if (iVar2 <= iVar11) {
                lVar35 = 0;
                do {
                  pdVar36[lVar35] =
                       (pdVar30[lVar35] - pdVar28[lVar35]) * dVar40 +
                       (*(double *)
                         ((long)local_100 + lVar35 * 8 + (long)iVar26 * lVar15 * 8 + lVar37) -
                       pdVar32[lVar35]) * dVar39 +
                       (pdVar18[local_150 * lVar20 +
                                (iVar24 - iVar6) * lVar19 +
                                (lVar33 - lVar34) * lVar16 +
                                (long)((iVar2 - iVar4) + 1 + (int)lVar35)] - pdVar25[lVar35]) *
                       dVar41;
                  lVar35 = lVar35 + 1;
                } while ((iVar11 - iVar2) + 1 != (int)lVar35);
              }
              lVar33 = lVar33 + 1;
              pdVar36 = pdVar36 + lVar13;
              pdVar28 = pdVar28 + lVar14;
              pdVar30 = pdVar30 + lVar14;
              pdVar32 = pdVar32 + lVar15;
              pdVar25 = pdVar25 + lVar16;
            } while (iVar12 + 1 != (int)lVar33);
          }
          bVar38 = iVar24 != iVar10;
          iVar24 = iVar24 + 1;
        } while (bVar38);
      }
      local_150 = local_150 + 1;
      local_e0 = local_e0 + lVar17;
      local_e8 = local_e8 + lVar23;
      local_f0 = local_f0 + lVar22;
      local_100 = local_100 + lVar22;
      local_f8 = local_f8 + lVar20;
    } while (local_150 != (uint)ncomp);
  }
  return;
}

Assistant:

void
HydroUtils::ComputeDivergence ( Box const& bx,
                                Array4<Real> const& div,
                                AMREX_D_DECL( Array4<Real const> const& fx,
                                              Array4<Real const> const& fy,
                                              Array4<Real const> const& fz),
                                const int ncomp, Geometry const& geom,
                                const Real mult,
                                const bool fluxes_are_area_weighted )
{
#if (AMREX_SPACEDIM == 2)
    if (geom.IsRZ()) {
        // Need metrics when using RZ
        const int ngrow_metric = 0;
        FArrayBox vol_fab;
        geom.GetVolume(vol_fab,BoxArray(bx),0,ngrow_metric);
        Elixir vol_eli = vol_fab.elixir();
        Array<FArrayBox,AMREX_SPACEDIM> area;
        Array<Elixir,AMREX_SPACEDIM> area_eli;
        if (!fluxes_are_area_weighted) {
            for (int dir = 0; dir < AMREX_SPACEDIM; ++dir)
            {
                geom.GetFaceArea(area[dir],BoxArray(bx),0,dir,ngrow_metric);
                area_eli[dir] = area[dir].elixir();
            }
        }
        const auto& vol = vol_fab.const_array();
        const auto& ax  = (fluxes_are_area_weighted) ? Array4<const Real>{}
                                                     : area[0].const_array();
        const auto& ay  = (fluxes_are_area_weighted) ? Array4<const Real>{}
                                                      : area[1].const_array();
        amrex::ParallelFor(bx, ncomp,[=]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            if (fluxes_are_area_weighted) {
                div(i,j,k,n) = ( fx(i+1,j,k,n) -  fx(i,j,k,n) +
                                 fy(i,j+1,k,n) -  fy(i,j,k,n) ) * mult / vol(i,j,k);
            } else {
                div(i,j,k,n) = ( ax(i+1,j,k)*fx(i+1,j,k,n) -  ax(i,j,k)*fx(i,j,k,n) +
                                 ay(i,j+1,k)*fy(i,j+1,k,n) -  ay(i,j,k)*fy(i,j,k,n) ) * mult / vol(i,j,k);
            }
        });
    } else
#endif
    {
        const auto dxinv = geom.InvCellSizeArray();
        AMREX_D_TERM(Real fact_x = mult;,
                     Real fact_y = mult;,
                     Real fact_z = mult;);

        if (fluxes_are_area_weighted) {
            Real qvol = AMREX_D_TERM(dxinv[0],*dxinv[1],*dxinv[2]);

            AMREX_D_TERM(fact_x *= qvol;,
                         fact_y *= qvol;,
                         fact_z *= qvol;);
        } else {
            AMREX_D_TERM(fact_x *= dxinv[0];,
                         fact_y *= dxinv[1];,
                         fact_z *= dxinv[2];);
        }

        amrex::ParallelFor(bx, ncomp,[=]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            div(i,j,k,n) = AMREX_D_TERM(  fact_x * ( fx(i+1,j,k,n) - fx(i,j,k,n) ),
                                        + fact_y * ( fy(i,j+1,k,n) - fy(i,j,k,n) ),
                                        + fact_z * ( fz(i,j,k+1,n) - fz(i,j,k,n) ));
        });
    }